

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_internal_normalise_eol(mcpl_buffer_t *bufobj)

{
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  size_t __n;
  mcpl_buffer_t *in_RDI;
  size_t ncopy;
  size_t ncopym1;
  char *hit_1;
  char *bufE_1;
  char *buf_1;
  char *dest;
  mcpl_buffer_t out;
  size_t count_rn_replaced;
  char *hit;
  char *bufE;
  char *buf;
  size_t count_rn;
  size_t in_stack_ffffffffffffff90;
  char *local_58;
  char *local_50;
  mcpl_buffer_t local_48;
  long local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  long local_10;
  mcpl_buffer_t *local_8;
  
  local_10 = 0;
  local_18 = in_RDI->buf;
  local_20 = local_18 + in_RDI->size;
  local_8 = in_RDI;
  while ((local_18 != local_20 &&
         (local_28 = (undefined1 *)memchr(local_18,0xd,(long)local_20 - (long)local_18),
         local_28 != (undefined1 *)0x0))) {
    local_18 = local_28 + 1;
    if ((local_18 == local_20) || (*local_18 != '\n')) {
      *local_28 = 10;
    }
    else {
      local_10 = local_10 + 1;
      local_18 = local_28 + 2;
    }
  }
  if (local_10 != 0) {
    local_30 = 0;
    mcpl_internal_buf_create(in_stack_ffffffffffffff90);
    local_50 = local_48.buf;
    local_58 = local_8->buf;
    pcVar1 = local_58 + local_8->size;
    for (; local_58 != pcVar1; local_58 = local_58 + 1) {
      pvVar2 = memchr(local_58,0xd,(long)pcVar1 - (long)local_58);
      if (pvVar2 == (void *)0x0) {
        memcpy(local_50,local_58,(long)pcVar1 - (long)local_58);
        break;
      }
      local_30 = local_30 + 1;
      lVar3 = (long)pvVar2 - (long)local_58;
      __n = lVar3 + 1;
      memcpy(local_50,local_58,__n);
      local_50 = local_50 + lVar3;
      local_58 = local_58 + __n;
      if (((local_58 == pcVar1) || (*local_58 != '\n')) || (*local_50 != '\r')) {
        mcpl_error((char *)0x109a4c);
      }
      *local_50 = '\n';
      local_50 = local_50 + 1;
    }
    local_48.size = local_48.capacity;
    if (local_30 != local_10) {
      mcpl_error((char *)0x109a97);
    }
    mcpl_internal_buf_swap(&local_48,local_8);
    free(local_48.buf);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_normalise_eol( mcpl_buffer_t* bufobj )
{
  //Replace \r\n with \n and \r with \n.

  //First replace all \r not followed by \n inplace. Noting down if we saw any
  //\r\n along the way:
  size_t count_rn = 0;
  {
    char * buf = bufobj->buf;
    char * bufE = buf + bufobj->size;
    while( buf != bufE ) {
      char * hit = (char*)memchr( buf, '\r', bufE - buf );
      if (!hit)
        break;//done
      buf = hit + 1;
      if ( buf == bufE || *buf != '\n' ) {
        *hit = '\n';// \r but not \r\n so just with \n
      } else {
        //must be \r\n
        ++count_rn;
        ++buf;//skip over the \n
      }
    }
  }

  if (!count_rn)
    return;//done, we were able to fix everything inplace

  //Next replace \r\n with \n, requiring us to copy everything except any \r
  //chars to a new buffer:
  {
    size_t count_rn_replaced = 0;
    mcpl_buffer_t out = mcpl_internal_buf_create( bufobj->size - count_rn );
    char * dest = out.buf;
    {
      const char * buf = bufobj->buf;
      const char * bufE = buf + bufobj->size;
      while ( buf != bufE ) {
        char * hit = (char*)memchr( buf, '\r', bufE-buf );
        if (!hit) {
          //no more hits, just copy the rest:
          memcpy(dest,buf,bufE-buf);
          break;
        }
        ++count_rn_replaced;
        size_t ncopym1 = hit-buf;
        size_t ncopy = ncopym1+1;
        memcpy(dest,buf,ncopy);
        dest += ncopym1;
        buf += ncopy;
        if (buf==bufE || *buf != '\n' || *dest!='\r' )
          mcpl_error(" mcpl_internal_normalise_eol logic error (1)");
        *dest = '\n';
        ++dest;
        ++buf;//skip original '\n'
      }
      out.size = out.capacity;
      if ( count_rn_replaced != count_rn )
        mcpl_error(" mcpl_internal_normalise_eol logic error (2)");
      mcpl_internal_buf_swap(&out,bufobj);
      free(out.buf);
    }
  }
}